

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O0

void accumulate(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,size_t max_r,
               size_t max_s,int *box,inform_error *err)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  size_t local_80;
  size_t k_1;
  size_t k;
  size_t j;
  size_t i_1;
  size_t i;
  size_t w;
  int *states;
  int *qs;
  int *data;
  size_t *r_local;
  int *b_local;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  __ptr = malloc(l << 3);
  if (__ptr == (void *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  else {
    lVar1 = ((m - max_r) - max_s) + 1;
    for (i_1 = 0; i_1 < n * lVar1; i_1 = i_1 + 1) {
      box[i_1] = 0;
    }
    for (j = 0; j < l; j = j + 1) {
      for (k = 0; k < n; k = k + 1) {
        *(undefined4 *)((long)__ptr + j * 4) = 1;
        *(undefined4 *)((long)__ptr + j * 4 + l * 4) = 0;
        for (k_1 = max_r - r[j]; k_1 < max_r + s[j]; k_1 = k_1 + 1) {
          *(int *)((long)__ptr + j * 4) = b[j] * *(int *)((long)__ptr + j * 4);
          *(int *)((long)__ptr + j * 4 + l * 4) = b[j] * *(int *)((long)__ptr + j * 4 + l * 4);
          *(int *)((long)__ptr + j * 4 + l * 4) =
               series[k_1 + m * (k + n * j)] + *(int *)((long)__ptr + j * 4 + l * 4);
        }
        box[lVar1 * k] = *(int *)((long)__ptr + j * 4) * box[lVar1 * k];
        box[lVar1 * k] = *(int *)((long)__ptr + j * 4 + l * 4) + box[lVar1 * k];
        for (local_80 = max_r; local_80 < m - max_s; local_80 = local_80 + 1) {
          *(int *)((long)__ptr + j * 4 + l * 4) = b[j] * *(int *)((long)__ptr + j * 4 + l * 4);
          *(int *)((long)__ptr + j * 4 + l * 4) =
               *(int *)((long)__ptr + j * 4 + l * 4) -
               series[(local_80 - r[j]) + m * (k + n * j)] * *(int *)((long)__ptr + j * 4);
          *(int *)((long)__ptr + j * 4 + l * 4) =
               series[local_80 + s[j] + m * (k + n * j)] + *(int *)((long)__ptr + j * 4 + l * 4);
          lVar2 = (local_80 - max_r) + 1 + lVar1 * k;
          box[lVar2] = *(int *)((long)__ptr + j * 4) * box[lVar2];
          lVar2 = (local_80 - max_r) + 1 + lVar1 * k;
          box[lVar2] = *(int *)((long)__ptr + j * 4 + l * 4) + box[lVar2];
        }
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

inline static void accumulate(int const *series, size_t l, size_t n,
    int const *b, inform_dist *joint, inform_dist **marginals)
{
    joint->counts = n;
    for (size_t i = 0; i < l; ++i)
    {
        marginals[i]->counts = n;
    }

    for (size_t i = 0; i < n; ++i)
    {
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            joint_event = joint_event * b[j] + series[i + n * j];
            marginals[j]->histogram[series[i + n * j]]++;
        }
        joint->histogram[joint_event]++;
    }
}